

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void flatbuffers::SetAnyValueS(BaseType type,uint8_t *data,char *val)

{
  int64_t val_00;
  double d;
  
  if (type - Float < 2) {
    StringToFloatImpl<double>(&d,val);
    SetAnyValueF(type,data,d);
    return;
  }
  val_00 = StringToInt(val,10);
  SetAnyValueI(type,data,val_00);
  return;
}

Assistant:

void SetAnyValueS(reflection::BaseType type, uint8_t *data, const char *val) {
  switch (type) {
    case reflection::Float:
    case reflection::Double: {
      double d;
      StringToNumber(val, &d);
      SetAnyValueF(type, data, d);
      break;
    }
    // TODO: support strings.
    default: SetAnyValueI(type, data, StringToInt(val)); break;
  }
}